

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O1

size_t Curl_ftp_parselist(char *buffer,size_t size,size_t nmemb,void *connptr)

{
  uint *puVar1;
  dynbuf *s;
  char cVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  CURLcode CVar6;
  int iVar7;
  CURLofft CVar8;
  uint uVar9;
  int iVar10;
  fileinfo *pfVar11;
  char *pcVar12;
  long lVar13;
  void *pvVar14;
  curlfiletype cVar15;
  size_t __n;
  ulong uVar16;
  ulong uVar17;
  char c;
  char *p;
  curl_off_t fsize;
  byte local_69;
  char *local_68;
  size_t local_60;
  Curl_easy *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  long local_38;
  
  uVar16 = size * nmemb;
  piVar3 = (int *)**(undefined8 **)(*(long *)((long)connptr + 0x1350) + 0x30);
  local_50 = uVar16;
  if (piVar3[3] == 0) {
    if ((uVar16 != 0) && (*piVar3 == 0)) {
      *piVar3 = ((byte)(*buffer - 0x30U) < 10) + 1;
    }
    if (uVar16 != 0) {
      local_40 = uVar16 + 1;
      uVar17 = 0;
      local_68 = buffer;
      local_58 = (Curl_easy *)connptr;
      do {
        local_69 = buffer[uVar17];
        if (*(long *)(piVar3 + 4) == 0) {
          pfVar11 = Curl_fileinfo_alloc();
          *(fileinfo **)(piVar3 + 4) = pfVar11;
          if (pfVar11 != (fileinfo *)0x0) {
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[6] = 0;
            Curl_dyn_init(&pfVar11->buf,10000);
            goto LAB_005ddb61;
          }
          piVar3[3] = 0x1b;
          iVar7 = 2;
          goto LAB_005de6bd;
        }
LAB_005ddb61:
        pfVar11 = *(fileinfo **)(piVar3 + 4);
        s = &pfVar11->buf;
        CVar6 = Curl_dyn_addn(s,&local_69,1);
        if (CVar6 != CURLE_OK) {
          piVar3[3] = 0x1b;
          iVar7 = 2;
          buffer = local_68;
          goto LAB_005de6bd;
        }
        local_60 = Curl_dyn_len(s);
        pcVar12 = Curl_dyn_ptr(s);
        iVar7 = 2;
        buffer = local_68;
        if (*piVar3 == 2) {
          switch(piVar3[1]) {
          case 0:
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (uVar9 < 9) {
              __n = 0xc;
              pcVar12 = "0123456789-";
LAB_005de111:
              pvVar14 = memchr(pcVar12,(int)(char)local_69,__n);
              if (pvVar14 == (void *)0x0) goto LAB_005de11f;
            }
            else {
              if ((uVar9 != 9) || (local_69 != 0x20)) {
                piVar3[3] = 0x57;
                iVar7 = 2;
                goto LAB_005de6bd;
              }
              piVar3[1] = 1;
              piVar3[2] = 0;
            }
            break;
          case 1:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (piVar3[2] == 1) {
              if (local_69 != 0x20) {
                __n = 0xf;
                pcVar12 = "APM0123456789:";
                goto LAB_005de111;
              }
              *(long *)(piVar3 + 0x10) = *(long *)(piVar3 + 8);
              pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              piVar3[1] = 2;
              piVar3[2] = 0;
LAB_005de064:
              piVar3[6] = 0;
            }
            else if (((piVar3[2] == 0) && (local_69 != 9)) && (local_69 != 0x20)) goto LAB_005ddd79;
            break;
          case 2:
            iVar10 = piVar3[2];
            if (iVar10 != 1) goto LAB_005ddffd;
            iVar7 = piVar3[6];
            piVar3[6] = iVar7 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar7 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              lVar13 = *(long *)(piVar3 + 8);
              iVar7 = strcmp("<DIR>",pcVar12 + lVar13);
              if (iVar7 == 0) {
                (pfVar11->info).filetype = CURLFILETYPE_DIRECTORY;
                (pfVar11->info).size = 0;
              }
              else {
                CVar8 = curlx_strtoofft(pcVar12 + lVar13,&local_48,10,&(pfVar11->info).size);
                if (CVar8 != CURL_OFFT_OK) {
                  piVar3[3] = 0x57;
                  iVar7 = 2;
                  buffer = local_68;
                  goto LAB_005de6bd;
                }
                *(undefined4 *)(*(long *)(piVar3 + 4) + 8) = 0;
              }
              *(uint *)(*(long *)(piVar3 + 4) + 0x60) =
                   *(uint *)(*(long *)(piVar3 + 4) + 0x60) | 0x40;
              piVar3[6] = 0;
              piVar3[1] = 3;
              piVar3[2] = 0;
            }
            break;
          case 3:
            iVar10 = piVar3[2];
            if (iVar10 == 2) {
              if (local_69 != 10) goto LAB_005de11f;
              *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
            }
            else {
              if (iVar10 != 1) goto LAB_005ddffd;
              piVar3[6] = piVar3[6] + 1;
              if (local_69 != 10) {
                if (local_69 == 0xd) {
                  piVar3[2] = 2;
                  pcVar12[local_60 - 1] = '\0';
                }
                break;
              }
              *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
              pcVar12[local_60 - 1] = '\0';
            }
            ftp_pl_insert_finfo(local_58,pfVar11);
            piVar3[1] = 0;
            piVar3[2] = 0;
          }
          goto switchD_005ddbde_default;
        }
        if (*piVar3 != 1) {
          local_50 = local_40;
          goto LAB_005de6bd;
        }
        switch(piVar3[1]) {
        case 0:
          if (piVar3[2] == 1) {
            uVar9 = piVar3[6];
            piVar3[6] = uVar9 + 1;
            if (local_69 == 10) {
              pcVar12[uVar9] = '\0';
              iVar10 = strncmp("total ",pcVar12,6);
              if (iVar10 != 0) goto LAB_005de11f;
              for (pcVar12 = pcVar12 + 6; (*pcVar12 == '\t' || (*pcVar12 == ' '));
                  pcVar12 = pcVar12 + 1) {
              }
              do {
                cVar2 = *pcVar12;
                pcVar12 = pcVar12 + 1;
              } while ((byte)(cVar2 - 0x30U) < 10);
              if (cVar2 != '\0') {
                piVar3[3] = 0x57;
                iVar7 = 2;
                buffer = local_68;
                goto LAB_005de6bd;
              }
              piVar3[1] = 1;
              Curl_dyn_reset(s);
            }
            else if (local_69 == 0xd) {
              piVar3[6] = uVar9;
              Curl_dyn_setlen(s,local_60 - 1);
            }
          }
          else if (piVar3[2] == 0) {
            if (local_69 != 0x74) {
              piVar3[1] = 1;
              Curl_dyn_reset(s);
              iVar7 = 3;
              buffer = local_68;
              goto LAB_005de6bd;
            }
            piVar3[2] = 1;
            piVar3[6] = piVar3[6] + 1;
          }
          break;
        case 1:
          if (local_69 < 100) {
            if (local_69 < 0x62) {
              cVar15 = CURLFILETYPE_FILE;
              if (local_69 != 0x2d) {
                if (local_69 != 0x44) goto LAB_005de11f;
                cVar15 = CURLFILETYPE_DOOR;
              }
            }
            else if (local_69 == 0x62) {
              cVar15 = CURLFILETYPE_DEVICE_BLOCK;
            }
            else {
              if (local_69 != 99) goto LAB_005de11f;
              cVar15 = CURLFILETYPE_DEVICE_CHAR;
            }
          }
          else if (local_69 < 0x70) {
            if (local_69 == 100) {
              cVar15 = CURLFILETYPE_DIRECTORY;
            }
            else {
              if (local_69 != 0x6c) goto LAB_005de11f;
              cVar15 = CURLFILETYPE_SYMLINK;
            }
          }
          else if (local_69 == 0x70) {
            cVar15 = CURLFILETYPE_NAMEDPIPE;
          }
          else {
            if (local_69 != 0x73) goto LAB_005de11f;
            cVar15 = CURLFILETYPE_SOCKET;
          }
          (pfVar11->info).filetype = cVar15;
          piVar3[1] = 2;
          piVar3[6] = 0;
          piVar3[8] = 1;
          piVar3[9] = 0;
          break;
        case 2:
          uVar9 = piVar3[6] + 1;
          piVar3[6] = uVar9;
          if (uVar9 < 10) {
            __n = 9;
            pcVar12 = "rwx-tTsS";
            goto LAB_005de111;
          }
          if (uVar9 != 10) break;
          if (local_69 == 0x20) {
            pcVar12[10] = '\0';
            lVar13 = *(long *)(piVar3 + 8);
            uVar9 = ftp_pl_get_permission(pcVar12 + lVar13);
            if (0xffffff < uVar9) {
              piVar3[3] = 0x57;
              goto LAB_005de65d;
            }
            lVar4 = *(long *)(piVar3 + 4);
            puVar1 = (uint *)(lVar4 + 0x60);
            *puVar1 = *puVar1 | 8;
            *(uint *)(lVar4 + 0x18) = uVar9;
            *(long *)(piVar3 + 0x12) = lVar13;
            piVar3[6] = 0;
            piVar3[1] = 3;
            piVar3[2] = 0;
            iVar7 = 0;
            bVar5 = true;
          }
          else {
            piVar3[3] = 0x57;
LAB_005de65d:
            iVar7 = 2;
            bVar5 = false;
          }
          buffer = local_68;
          if (!bVar5) goto LAB_005de6bd;
          break;
        case 3:
          iVar10 = piVar3[2];
          if (iVar10 == 1) {
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              lVar13 = strtol(pcVar12 + *(long *)(piVar3 + 8),&local_48,10);
              if ((*local_48 == '\0') && (lVar13 + 0x7fffffffffffffffU < 0xfffffffffffffffe)) {
                lVar4 = *(long *)(piVar3 + 4);
                puVar1 = (uint *)(lVar4 + 0x60);
                *puVar1 = *puVar1 | 0x80;
                *(long *)(lVar4 + 0x30) = lVar13;
              }
              piVar3[6] = 0;
              piVar3[8] = 0;
              piVar3[9] = 0;
              piVar3[1] = 4;
              piVar3[2] = 0;
            }
            else {
LAB_005de203:
              if (9 < (byte)(local_69 - 0x30)) goto LAB_005de11f;
            }
          }
          else {
LAB_005ddfc8:
            if ((iVar10 == 0) && (local_69 != 0x20)) {
              if ((byte)(local_69 - 0x30) < 10) goto LAB_005de010;
              goto LAB_005de11f;
            }
          }
          break;
        case 4:
          iVar10 = piVar3[2];
          if (iVar10 == 1) {
            iVar7 = piVar3[6];
            piVar3[6] = iVar7 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar7 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0xc) = *(undefined8 *)(piVar3 + 8);
              piVar3[1] = 5;
              piVar3[2] = 0;
LAB_005ddfae:
              piVar3[8] = 0;
              piVar3[9] = 0;
              goto LAB_005de064;
            }
          }
          else {
LAB_005ddffd:
            if (iVar10 == 0) goto switchD_005dde0d_caseD_0;
          }
          break;
        case 5:
          iVar10 = piVar3[2];
          if (iVar10 != 1) goto LAB_005ddffd;
          iVar7 = piVar3[6];
          piVar3[6] = iVar7 + 1U;
          if (local_69 == 0x20) {
            pcVar12[((ulong)(iVar7 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 0xe) = *(undefined8 *)(piVar3 + 8);
            piVar3[1] = 6;
            piVar3[2] = 0;
            goto LAB_005ddfae;
          }
          break;
        case 6:
          iVar10 = piVar3[2];
          if (iVar10 != 1) goto LAB_005ddfc8;
          iVar10 = piVar3[6];
          piVar3[6] = iVar10 + 1U;
          if (local_69 != 0x20) goto LAB_005de203;
          pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
          CVar8 = curlx_strtoofft(pcVar12 + *(long *)(piVar3 + 8),&local_48,10,&local_38);
          if (CVar8 == CURL_OFFT_OK) {
            if (local_38 + 0x7fffffffffffffffU < 0xfffffffffffffffe && *local_48 == '\0') {
              lVar13 = *(long *)(piVar3 + 4);
              puVar1 = (uint *)(lVar13 + 0x60);
              *puVar1 = *puVar1 | 0x40;
              *(long *)(lVar13 + 0x28) = local_38;
            }
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            piVar3[1] = 7;
            piVar3[2] = 0;
          }
          break;
        case 7:
          switch(piVar3[2]) {
          case 0:
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_005de11f;
              goto LAB_005de010;
            }
            break;
          case 1:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 == 0x20) {
LAB_005de349:
              piVar3[2] = 2;
            }
            else {
LAB_005de356:
              if ((0x19 < (byte)(local_69 + 0x9f) && 9 < (byte)(local_69 - 0x30)) &&
                 (local_69 != 0x2e && (byte)(local_69 + 0xa5) < 0xe6)) goto LAB_005de11f;
            }
            break;
          case 2:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_005de11f;
LAB_005de472:
              piVar3[2] = 3;
            }
            break;
          case 3:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) goto LAB_005de356;
LAB_005de4a3:
            piVar3[2] = 4;
            break;
          case 4:
            piVar3[6] = piVar3[6] + 1;
            if (local_69 != 0x20) {
              if ((9 < (byte)(local_69 - 0x30)) && (0x19 < (byte)((local_69 & 0xdf) + 0xbf)))
              goto LAB_005de11f;
              piVar3[2] = 5;
            }
            break;
          case 5:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if (local_69 == 0x20) {
              pcVar12[((ulong)(iVar10 + 1U) - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0x10) = *(undefined8 *)(piVar3 + 8);
              if ((pfVar11->info).filetype == CURLFILETYPE_SYMLINK) {
                piVar3[1] = 9;
                piVar3[2] = 0;
              }
              else {
                piVar3[1] = 8;
                piVar3[2] = 0;
              }
            }
            else if (((((byte)(local_69 - 0x3a) < 0xf6) && ((byte)((local_69 & 0xdf) + 0xa5) < 0xe6)
                      ) && (local_69 != 0x2e)) && (local_69 != 0x3a)) goto LAB_005de11f;
          }
          break;
        case 8:
          iVar10 = piVar3[2];
          if (iVar10 == 2) {
            if (local_69 != 10) goto LAB_005de11f;
            uVar9 = piVar3[6];
          }
          else {
            if (iVar10 != 1) goto LAB_005ddffd;
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (local_69 != 10) {
              if (local_69 == 0xd) goto LAB_005de349;
              break;
            }
          }
          pcVar12[((ulong)uVar9 - 1) + *(long *)(piVar3 + 8)] = '\0';
          *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
          piVar3[1] = 1;
          ftp_pl_insert_finfo(local_58,pfVar11);
          break;
        case 9:
          switch(piVar3[2]) {
          case 0:
switchD_005dde0d_caseD_0:
            if (local_69 != 0x20) {
LAB_005de010:
              *(size_t *)(piVar3 + 8) = local_60 - 1;
              piVar3[6] = 1;
              piVar3[2] = 1;
            }
            break;
          case 1:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_005de11f;
            if (local_69 == 0x20) goto LAB_005de349;
            break;
          case 2:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_005de11f;
            if (local_69 == 0x2d) goto LAB_005de472;
LAB_005ddd79:
            piVar3[2] = 1;
            break;
          case 3:
            piVar3[6] = piVar3[6] + 1;
            if ((local_69 != 10) && (local_69 != 0xd)) {
              if (local_69 == 0x3e) goto LAB_005de4a3;
              goto LAB_005ddd79;
            }
            goto LAB_005de11f;
          case 4:
            iVar10 = piVar3[6];
            piVar3[6] = iVar10 + 1U;
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_005de11f;
            if (local_69 != 0x20) goto LAB_005ddd79;
            piVar3[2] = 5;
            pcVar12[((ulong)(iVar10 + 1U) - 4) + *(long *)(piVar3 + 8)] = '\0';
            *(undefined8 *)(piVar3 + 10) = *(undefined8 *)(piVar3 + 8);
            piVar3[6] = 0;
            piVar3[8] = 0;
            piVar3[9] = 0;
            break;
          case 5:
            if ((local_69 == 10) || (local_69 == 0xd)) goto LAB_005de11f;
            piVar3[2] = 6;
            *(size_t *)(piVar3 + 8) = local_60 - 1;
            piVar3[6] = 1;
            break;
          case 6:
            uVar9 = piVar3[6] + 1;
            piVar3[6] = uVar9;
            if (local_69 == 10) {
LAB_005de667:
              pcVar12[((ulong)uVar9 - 1) + *(long *)(piVar3 + 8)] = '\0';
              *(undefined8 *)(piVar3 + 0x14) = *(undefined8 *)(piVar3 + 8);
              ftp_pl_insert_finfo(local_58,pfVar11);
              piVar3[1] = 1;
            }
            else if (local_69 == 0xd) {
              piVar3[2] = 7;
            }
            break;
          case 7:
            if (local_69 == 10) {
              uVar9 = piVar3[6];
              goto LAB_005de667;
            }
LAB_005de11f:
            piVar3[3] = 0x57;
            buffer = local_68;
            goto LAB_005de6bd;
          }
        }
switchD_005ddbde_default:
        uVar17 = uVar17 + 1;
        iVar7 = 0;
        buffer = local_68;
LAB_005de6bd:
        if ((iVar7 != 0) && (iVar7 != 3)) {
          if (iVar7 != 2) {
            return local_50;
          }
          goto LAB_005ddabc;
        }
      } while (uVar17 < uVar16);
    }
  }
  else {
LAB_005ddabc:
    if (*(fileinfo **)(piVar3 + 4) != (fileinfo *)0x0) {
      Curl_fileinfo_cleanup(*(fileinfo **)(piVar3 + 4));
      piVar3[4] = 0;
      piVar3[5] = 0;
    }
  }
  return local_50;
}

Assistant:

size_t Curl_ftp_parselist(char *buffer, size_t size, size_t nmemb,
                          void *connptr)
{
  size_t bufflen = size*nmemb;
  struct Curl_easy *data = (struct Curl_easy *)connptr;
  struct ftp_wc *ftpwc = data->wildcard->ftpwc;
  struct ftp_parselist_data *parser = ftpwc->parser;
  size_t i = 0;
  CURLcode result;
  size_t retsize = bufflen;

  if(parser->error) { /* error in previous call */
    /* scenario:
     * 1. call => OK..
     * 2. call => OUT_OF_MEMORY (or other error)
     * 3. (last) call => is skipped RIGHT HERE and the error is handled later
     *    in wc_statemach()
     */
    goto fail;
  }

  if(parser->os_type == OS_TYPE_UNKNOWN && bufflen > 0) {
    /* considering info about FILE response format */
    parser->os_type = ISDIGIT(buffer[0]) ? OS_TYPE_WIN_NT : OS_TYPE_UNIX;
  }

  while(i < bufflen) { /* FSM */
    char *mem;
    size_t len; /* number of bytes of data in the dynbuf */
    char c = buffer[i];
    struct fileinfo *infop;
    struct curl_fileinfo *finfo;
    if(!parser->file_data) { /* tmp file data is not allocated yet */
      parser->file_data = Curl_fileinfo_alloc();
      if(!parser->file_data) {
        parser->error = CURLE_OUT_OF_MEMORY;
        goto fail;
      }
      parser->item_offset = 0;
      parser->item_length = 0;
      Curl_dyn_init(&parser->file_data->buf, MAX_FTPLIST_BUFFER);
    }

    infop = parser->file_data;
    finfo = &infop->info;

    if(Curl_dyn_addn(&infop->buf, &c, 1)) {
      parser->error = CURLE_OUT_OF_MEMORY;
      goto fail;
    }
    len = Curl_dyn_len(&infop->buf);
    mem = Curl_dyn_ptr(&infop->buf);

    switch(parser->os_type) {
    case OS_TYPE_UNIX:
      switch(parser->state.UNIX.main) {
      case PL_UNIX_TOTALSIZE:
        switch(parser->state.UNIX.sub.total_dirsize) {
        case PL_UNIX_TOTALSIZE_INIT:
          if(c == 't') {
            parser->state.UNIX.sub.total_dirsize = PL_UNIX_TOTALSIZE_READING;
            parser->item_length++;
          }
          else {
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            /* start FSM again not considering size of directory */
            Curl_dyn_reset(&infop->buf);
            continue;
          }
          break;
        case PL_UNIX_TOTALSIZE_READING:
          parser->item_length++;
          if(c == '\r') {
            parser->item_length--;
            Curl_dyn_setlen(&infop->buf, --len);
          }
          else if(c == '\n') {
            mem[parser->item_length - 1] = 0;
            if(!strncmp("total ", mem, 6)) {
              char *endptr = mem + 6;
              /* here we can deal with directory size, pass the leading
                 whitespace and then the digits */
              while(ISBLANK(*endptr))
                endptr++;
              while(ISDIGIT(*endptr))
                endptr++;
              if(*endptr) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              parser->state.UNIX.main = PL_UNIX_FILETYPE;
              Curl_dyn_reset(&infop->buf);
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        }
        break;
      case PL_UNIX_FILETYPE:
        switch(c) {
        case '-':
          finfo->filetype = CURLFILETYPE_FILE;
          break;
        case 'd':
          finfo->filetype = CURLFILETYPE_DIRECTORY;
          break;
        case 'l':
          finfo->filetype = CURLFILETYPE_SYMLINK;
          break;
        case 'p':
          finfo->filetype = CURLFILETYPE_NAMEDPIPE;
          break;
        case 's':
          finfo->filetype = CURLFILETYPE_SOCKET;
          break;
        case 'c':
          finfo->filetype = CURLFILETYPE_DEVICE_CHAR;
          break;
        case 'b':
          finfo->filetype = CURLFILETYPE_DEVICE_BLOCK;
          break;
        case 'D':
          finfo->filetype = CURLFILETYPE_DOOR;
          break;
        default:
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        parser->state.UNIX.main = PL_UNIX_PERMISSION;
        parser->item_length = 0;
        parser->item_offset = 1;
        break;
      case PL_UNIX_PERMISSION:
        parser->item_length++;
        if(parser->item_length <= 9) {
          if(!strchr("rwx-tTsS", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 10) {
          unsigned int perm;
          if(c != ' ') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          mem[10] = 0; /* terminate permissions */
          perm = ftp_pl_get_permission(mem + parser->item_offset);
          if(perm & FTP_LP_MALFORMATED_PERM) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_PERM;
          parser->file_data->info.perm = perm;
          parser->offsets.perm = parser->item_offset;

          parser->item_length = 0;
          parser->state.UNIX.main = PL_UNIX_HLINKS;
          parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_PRESPACE;
        }
        break;
      case PL_UNIX_HLINKS:
        switch(parser->state.UNIX.sub.hlinks) {
        case PL_UNIX_HLINKS_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.hlinks = PL_UNIX_HLINKS_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_HLINKS_NUMBER:
          parser->item_length ++;
          if(c == ' ') {
            char *p;
            long int hlinks;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            hlinks = strtol(mem + parser->item_offset, &p, 10);
            if(p[0] == '\0' && hlinks != LONG_MAX && hlinks != LONG_MIN) {
              parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_HLINKCOUNT;
              parser->file_data->info.hardlinks = hlinks;
            }
            parser->item_length = 0;
            parser->item_offset = 0;
            parser->state.UNIX.main = PL_UNIX_USER;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PRESPACE;
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_USER:
        switch(parser->state.UNIX.sub.user) {
        case PL_UNIX_USER_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.user = PL_UNIX_USER_PARSING;
          }
          break;
        case PL_UNIX_USER_PARSING:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.user = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_GROUP;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_GROUP:
        switch(parser->state.UNIX.sub.group) {
        case PL_UNIX_GROUP_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.group = PL_UNIX_GROUP_NAME;
          }
          break;
        case PL_UNIX_GROUP_NAME:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.group = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_SIZE;
            parser->state.UNIX.sub.size = PL_UNIX_SIZE_PRESPACE;
            parser->item_offset = 0;
            parser->item_length = 0;
          }
          break;
        }
        break;
      case PL_UNIX_SIZE:
        switch(parser->state.UNIX.sub.size) {
        case PL_UNIX_SIZE_PRESPACE:
          if(c != ' ') {
            if(ISDIGIT(c)) {
              parser->item_offset = len - 1;
              parser->item_length = 1;
              parser->state.UNIX.sub.size = PL_UNIX_SIZE_NUMBER;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_SIZE_NUMBER:
          parser->item_length++;
          if(c == ' ') {
            char *p;
            curl_off_t fsize;
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(!curlx_strtoofft(mem + parser->item_offset,
                                &p, 10, &fsize)) {
              if(p[0] == '\0' && fsize != CURL_OFF_T_MAX &&
                 fsize != CURL_OFF_T_MIN) {
                parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
                parser->file_data->info.size = fsize;
              }
              parser->item_length = 0;
              parser->item_offset = 0;
              parser->state.UNIX.main = PL_UNIX_TIME;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART1;
            }
          }
          else if(!ISDIGIT(c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_TIME:
        switch(parser->state.UNIX.sub.time) {
        case PL_UNIX_TIME_PREPART1:
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->item_offset = len -1;
              parser->item_length = 1;
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART1;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART1:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART2;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART2:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART2;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART2:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.time = PL_UNIX_TIME_PREPART3;
          }
          else if(!ISALNUM(c) && c != '.') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_TIME_PREPART3:
          parser->item_length++;
          if(c != ' ') {
            if(ISALNUM(c)) {
              parser->state.UNIX.sub.time = PL_UNIX_TIME_PART3;
            }
            else {
              parser->error = CURLE_FTP_BAD_FILE_LIST;
              goto fail;
            }
          }
          break;
        case PL_UNIX_TIME_PART3:
          parser->item_length++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->offsets.time = parser->item_offset;
            /*
              if(ftp_pl_gettime(parser, finfo->mem + parser->item_offset)) {
                parser->file_data->flags |= CURLFINFOFLAG_KNOWN_TIME;
              }
            */
            if(finfo->filetype == CURLFILETYPE_SYMLINK) {
              parser->state.UNIX.main = PL_UNIX_SYMLINK;
              parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRESPACE;
            }
            else {
              parser->state.UNIX.main = PL_UNIX_FILENAME;
              parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_PRESPACE;
            }
          }
          else if(!ISALNUM(c) && c != '.' && c != ':') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_FILENAME:
        switch(parser->state.UNIX.sub.filename) {
        case PL_UNIX_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_NAME;
          }
          break;
        case PL_UNIX_FILENAME_NAME:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.filename = PL_UNIX_FILENAME_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          break;
        case PL_UNIX_FILENAME_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_UNIX_SYMLINK:
        switch(parser->state.UNIX.sub.symlink) {
        case PL_UNIX_SYMLINK_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_NAME:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET1;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET1:
          parser->item_length++;
          if(c == '-') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET2;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET2:
          parser->item_length++;
          if(c == '>') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET3;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET3:
          parser->item_length++;
          if(c == ' ') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_PRETARGET4;
            /* now place where is symlink following */
            mem[parser->item_offset + parser->item_length - 4] = 0;
            parser->offsets.filename = parser->item_offset;
            parser->item_length = 0;
            parser->item_offset = 0;
          }
          else if(c == '\r' || c == '\n') {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          else {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_NAME;
          }
          break;
        case PL_UNIX_SYMLINK_PRETARGET4:
          if(c != '\r' && c != '\n') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_TARGET;
            parser->item_offset = len - 1;
            parser->item_length = 1;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        case PL_UNIX_SYMLINK_TARGET:
          parser->item_length++;
          if(c == '\r') {
            parser->state.UNIX.sub.symlink = PL_UNIX_SYMLINK_WINDOWSEOL;
          }
          else if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          break;
        case PL_UNIX_SYMLINK_WINDOWSEOL:
          if(c == '\n') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            parser->offsets.symlink_target = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.UNIX.main = PL_UNIX_FILETYPE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    case OS_TYPE_WIN_NT:
      switch(parser->state.NT.main) {
      case PL_WINNT_DATE:
        parser->item_length++;
        if(parser->item_length < 9) {
          if(!strchr("0123456789-", c)) { /* only simple control */
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else if(parser->item_length == 9) {
          if(c == ' ') {
            parser->state.NT.main = PL_WINNT_TIME;
            parser->state.NT.sub.time = PL_WINNT_TIME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
        }
        else {
          parser->error = CURLE_FTP_BAD_FILE_LIST;
          goto fail;
        }
        break;
      case PL_WINNT_TIME:
        parser->item_length++;
        switch(parser->state.NT.sub.time) {
        case PL_WINNT_TIME_PRESPACE:
          if(!ISBLANK(c)) {
            parser->state.NT.sub.time = PL_WINNT_TIME_TIME;
          }
          break;
        case PL_WINNT_TIME_TIME:
          if(c == ' ') {
            parser->offsets.time = parser->item_offset;
            mem[parser->item_offset + parser->item_length -1] = 0;
            parser->state.NT.main = PL_WINNT_DIRORSIZE;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_PRESPACE;
            parser->item_length = 0;
          }
          else if(!strchr("APM0123456789:", c)) {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      case PL_WINNT_DIRORSIZE:
        switch(parser->state.NT.sub.dirorsize) {
        case PL_WINNT_DIRORSIZE_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len - 1;
            parser->item_length = 1;
            parser->state.NT.sub.dirorsize = PL_WINNT_DIRORSIZE_CONTENT;
          }
          break;
        case PL_WINNT_DIRORSIZE_CONTENT:
          parser->item_length ++;
          if(c == ' ') {
            mem[parser->item_offset + parser->item_length - 1] = 0;
            if(strcmp("<DIR>", mem + parser->item_offset) == 0) {
              finfo->filetype = CURLFILETYPE_DIRECTORY;
              finfo->size = 0;
            }
            else {
              char *endptr;
              if(curlx_strtoofft(mem +
                                 parser->item_offset,
                                 &endptr, 10, &finfo->size)) {
                parser->error = CURLE_FTP_BAD_FILE_LIST;
                goto fail;
              }
              /* correct file type */
              parser->file_data->info.filetype = CURLFILETYPE_FILE;
            }

            parser->file_data->info.flags |= CURLFINFOFLAG_KNOWN_SIZE;
            parser->item_length = 0;
            parser->state.NT.main = PL_WINNT_FILENAME;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        }
        break;
      case PL_WINNT_FILENAME:
        switch(parser->state.NT.sub.filename) {
        case PL_WINNT_FILENAME_PRESPACE:
          if(c != ' ') {
            parser->item_offset = len -1;
            parser->item_length = 1;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_CONTENT;
          }
          break;
        case PL_WINNT_FILENAME_CONTENT:
          parser->item_length++;
          if(c == '\r') {
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_WINEOL;
            mem[len - 1] = 0;
          }
          else if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            mem[len - 1] = 0;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          break;
        case PL_WINNT_FILENAME_WINEOL:
          if(c == '\n') {
            parser->offsets.filename = parser->item_offset;
            result = ftp_pl_insert_finfo(data, infop);
            if(result) {
              parser->error = result;
              goto fail;
            }
            parser->state.NT.main = PL_WINNT_DATE;
            parser->state.NT.sub.filename = PL_WINNT_FILENAME_PRESPACE;
          }
          else {
            parser->error = CURLE_FTP_BAD_FILE_LIST;
            goto fail;
          }
          break;
        }
        break;
      }
      break;
    default:
      retsize = bufflen + 1;
      goto fail;
    }

    i++;
  }
  return retsize;

fail:

  /* Clean up any allocated memory. */
  if(parser->file_data) {
    Curl_fileinfo_cleanup(parser->file_data);
    parser->file_data = NULL;
  }

  return retsize;
}